

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O3

void lowbd_fwd_txfm2d_64x64_avx2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  int32_t *piVar1;
  byte bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int8_t *piVar6;
  bool bVar7;
  int16_t *piVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  bool bVar12;
  long lVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  __m256i buf0 [64];
  __m256i bufB [64];
  __m256i bufA [64];
  __m256i buf1 [256];
  longlong local_3860 [256];
  longlong local_3060 [256];
  longlong local_2860 [256];
  longlong alStack_2060 [2];
  undefined1 local_2050 [2032];
  longlong alStack_1860 [774];
  
  piVar6 = av1_fwd_txfm_shift_ls[4];
  lVar13 = 0;
  do {
    lVar10 = 0;
    piVar8 = input;
    do {
      uVar3 = *(undefined8 *)(piVar8 + 4);
      uVar4 = *(undefined8 *)(piVar8 + 8);
      uVar5 = *(undefined8 *)(piVar8 + 0xc);
      *(undefined8 *)((long)local_3860 + lVar10) = *(undefined8 *)piVar8;
      *(undefined8 *)((long)local_3860 + lVar10 + 8) = uVar3;
      *(undefined8 *)((long)local_3860 + lVar10 + 0x10) = uVar4;
      *(undefined8 *)((long)local_3860 + lVar10 + 0x18) = uVar5;
      lVar10 = lVar10 + 0x20;
      piVar8 = piVar8 + stride;
    } while (lVar10 != 0x800);
    bVar2 = *piVar6;
    if ((char)bVar2 < '\0') {
      auVar14._0_2_ = (undefined2)(1 << (~bVar2 & 0x1f));
      auVar14._2_2_ = auVar14._0_2_;
      auVar14._4_2_ = auVar14._0_2_;
      auVar14._6_2_ = auVar14._0_2_;
      auVar14._8_2_ = auVar14._0_2_;
      auVar14._10_2_ = auVar14._0_2_;
      auVar14._12_2_ = auVar14._0_2_;
      auVar14._14_2_ = auVar14._0_2_;
      auVar14._16_2_ = auVar14._0_2_;
      auVar14._18_2_ = auVar14._0_2_;
      auVar14._20_2_ = auVar14._0_2_;
      auVar14._22_2_ = auVar14._0_2_;
      auVar14._24_2_ = auVar14._0_2_;
      auVar14._26_2_ = auVar14._0_2_;
      auVar14._28_2_ = auVar14._0_2_;
      auVar14._30_2_ = auVar14._0_2_;
      lVar10 = 0;
      do {
        auVar15 = vpaddsw_avx2(auVar14,*(undefined1 (*) [32])((long)local_3860 + lVar10));
        auVar15 = vpsraw_avx2(auVar15,ZEXT416((uint)-(int)(char)bVar2));
        *(undefined1 (*) [32])((long)local_3860 + lVar10) = auVar15;
        lVar10 = lVar10 + 0x20;
      } while (lVar10 != 0x800);
    }
    else if (bVar2 != 0) {
      lVar10 = 0;
      do {
        auVar14 = vpsllw_avx2(*(undefined1 (*) [32])((long)local_3860 + lVar10),
                              ZEXT416((uint)(int)(char)bVar2));
        *(undefined1 (*) [32])((long)local_3860 + lVar10) = auVar14;
        lVar10 = lVar10 + 0x20;
      } while (lVar10 != 0x800);
    }
    fdct16x64_new_avx2((__m256i *)local_3860,(__m256i *)local_3860,'\r');
    bVar2 = piVar6[1];
    uVar9 = (uint)(char)bVar2;
    if ((int)uVar9 < 0) {
      auVar15._0_2_ = (undefined2)(1 << (~bVar2 & 0x1f));
      auVar15._2_2_ = auVar15._0_2_;
      auVar15._4_2_ = auVar15._0_2_;
      auVar15._6_2_ = auVar15._0_2_;
      auVar15._8_2_ = auVar15._0_2_;
      auVar15._10_2_ = auVar15._0_2_;
      auVar15._12_2_ = auVar15._0_2_;
      auVar15._14_2_ = auVar15._0_2_;
      auVar15._16_2_ = auVar15._0_2_;
      auVar15._18_2_ = auVar15._0_2_;
      auVar15._20_2_ = auVar15._0_2_;
      auVar15._22_2_ = auVar15._0_2_;
      auVar15._24_2_ = auVar15._0_2_;
      auVar15._26_2_ = auVar15._0_2_;
      auVar15._28_2_ = auVar15._0_2_;
      auVar15._30_2_ = auVar15._0_2_;
      lVar10 = 0;
      do {
        auVar14 = vpaddsw_avx2(auVar15,*(undefined1 (*) [32])((long)local_3860 + lVar10));
        auVar14 = vpsraw_avx2(auVar14,ZEXT416(-uVar9));
        *(undefined1 (*) [32])((long)local_3860 + lVar10) = auVar14;
        lVar10 = lVar10 + 0x20;
      } while (lVar10 != 0x800);
    }
    else if (bVar2 != 0) {
      lVar10 = 0;
      do {
        auVar14 = vpsllw_avx2(*(undefined1 (*) [32])((long)local_3860 + lVar10),ZEXT416(uVar9));
        *(undefined1 (*) [32])((long)local_3860 + lVar10) = auVar14;
        lVar10 = lVar10 + 0x20;
      } while (lVar10 != 0x800);
    }
    transpose_16bit_16x16_avx2((__m256i *)local_3860,(__m256i *)(alStack_2060 + lVar13 * 0x40));
    transpose_16bit_16x16_avx2
              ((__m256i *)(local_3860 + 0x40),(__m256i *)(alStack_1860 + lVar13 * 0x40));
    lVar13 = lVar13 + 1;
    input = input + 0x10;
  } while (lVar13 != 4);
  lVar13 = 0;
  bVar7 = true;
  do {
    bVar12 = bVar7;
    lVar10 = 0;
    do {
      auVar14 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)alStack_2060 + lVar10 + lVar13 * 0x800))
      ;
      auVar15 = vpmovsxwd_avx2(*(undefined1 (*) [16])(local_2050 + lVar10 + lVar13 * 0x800));
      *(undefined1 (*) [32])((long)local_2860 + lVar10) = auVar14;
      *(undefined1 (*) [32])((long)local_3060 + lVar10) = auVar15;
      lVar10 = lVar10 + 0x20;
    } while (lVar10 != 0x800);
    fdct64_new_avx2((__m256i *)local_2860,(__m256i *)local_2860,'\n');
    fdct64_new_avx2((__m256i *)local_3060,(__m256i *)local_3060,'\n');
    bVar2 = piVar6[2];
    uVar9 = (uint)(char)bVar2;
    if ((int)uVar9 < 0) {
      iVar11 = 1 << (~bVar2 & 0x1f);
      auVar17._4_4_ = iVar11;
      auVar17._0_4_ = iVar11;
      auVar17._8_4_ = iVar11;
      auVar17._12_4_ = iVar11;
      auVar17._16_4_ = iVar11;
      auVar17._20_4_ = iVar11;
      auVar17._24_4_ = iVar11;
      auVar17._28_4_ = iVar11;
      lVar10 = 0;
      do {
        auVar14 = vpaddd_avx2(auVar17,*(undefined1 (*) [32])((long)local_2860 + lVar10));
        auVar14 = vpsrad_avx2(auVar14,ZEXT416(-uVar9));
        *(undefined1 (*) [32])((long)local_2860 + lVar10) = auVar14;
        lVar10 = lVar10 + 0x20;
      } while (lVar10 != 0x400);
    }
    else {
      lVar10 = 0;
      do {
        auVar14 = vpslld_avx2(*(undefined1 (*) [32])((long)local_2860 + lVar10),ZEXT416(uVar9));
        *(undefined1 (*) [32])((long)local_2860 + lVar10) = auVar14;
        lVar10 = lVar10 + 0x20;
      } while (lVar10 != 0x400);
    }
    if ((char)bVar2 < '\0') {
      iVar11 = 1 << (~bVar2 & 0x1f);
      auVar16._4_4_ = iVar11;
      auVar16._0_4_ = iVar11;
      auVar16._8_4_ = iVar11;
      auVar16._12_4_ = iVar11;
      auVar16._16_4_ = iVar11;
      auVar16._20_4_ = iVar11;
      auVar16._24_4_ = iVar11;
      auVar16._28_4_ = iVar11;
      lVar10 = 0;
      do {
        auVar14 = vpaddd_avx2(auVar16,*(undefined1 (*) [32])((long)local_3060 + lVar10));
        auVar14 = vpsrad_avx2(auVar14,ZEXT416(-uVar9));
        *(undefined1 (*) [32])((long)local_3060 + lVar10) = auVar14;
        lVar10 = lVar10 + 0x20;
      } while (lVar10 != 0x400);
    }
    else {
      lVar10 = 0;
      do {
        auVar14 = vpslld_avx2(*(undefined1 (*) [32])((long)local_3060 + lVar10),ZEXT416(uVar9));
        *(undefined1 (*) [32])((long)local_3060 + lVar10) = auVar14;
        lVar10 = lVar10 + 0x20;
      } while (lVar10 != 0x400);
    }
    lVar10 = 0;
    do {
      uVar3 = *(undefined8 *)((long)local_2860 + lVar10 + 8);
      uVar4 = *(undefined8 *)((long)local_2860 + lVar10 + 0x10);
      uVar5 = *(undefined8 *)((long)local_2860 + lVar10 + 0x18);
      piVar1 = output + lVar13 * 0x10 + lVar10;
      *(undefined8 *)piVar1 = *(undefined8 *)((long)local_2860 + lVar10);
      *(undefined8 *)(piVar1 + 2) = uVar3;
      *(undefined8 *)(piVar1 + 4) = uVar4;
      *(undefined8 *)(piVar1 + 6) = uVar5;
      uVar3 = *(undefined8 *)((long)local_3060 + lVar10 + 8);
      uVar4 = *(undefined8 *)((long)local_3060 + lVar10 + 0x10);
      uVar5 = *(undefined8 *)((long)local_3060 + lVar10 + 0x18);
      piVar1 = output + lVar13 * 0x10 + lVar10 + 8;
      *(undefined8 *)piVar1 = *(undefined8 *)((long)local_3060 + lVar10);
      *(undefined8 *)(piVar1 + 2) = uVar3;
      *(undefined8 *)(piVar1 + 4) = uVar4;
      *(undefined8 *)(piVar1 + 6) = uVar5;
      lVar10 = lVar10 + 0x20;
    } while (lVar10 != 0x400);
    lVar13 = 1;
    bVar7 = false;
  } while (bVar12);
  return;
}

Assistant:

static void lowbd_fwd_txfm2d_64x64_avx2(const int16_t *input, int32_t *output,
                                        int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  (void)tx_type;
  assert(tx_type == DCT_DCT);
  const TX_SIZE tx_size = TX_64X64;
  __m256i buf0[64], buf1[256];
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const transform_1d_avx2 col_txfm = fdct16x64_new_avx2;
  const int width_div16 = (width >> 4);
  const int height_div16 = (height >> 4);

  for (int i = 0; i < width_div16; i++) {
    load_buffer_16bit_to_16bit_avx2(input + 16 * i, stride, buf0, height);
    round_shift_16bit_w16_avx2(buf0, height, shift[0]);
    col_txfm(buf0, buf0, cos_bit_col);
    round_shift_16bit_w16_avx2(buf0, height, shift[1]);
    for (int j = 0; j < AOMMIN(2, height_div16); ++j) {
      transpose_16bit_16x16_avx2(buf0 + j * 16, buf1 + j * width + 16 * i);
    }
  }

  for (int i = 0; i < AOMMIN(2, height_div16); i++) {
    __m256i bufA[64];
    __m256i bufB[64];
    __m128i *buf = (__m128i *)(buf1 + width * i);
    for (int j = 0; j < width; ++j) {
      bufA[j] = _mm256_cvtepi16_epi32(buf[j * 2]);
      bufB[j] = _mm256_cvtepi16_epi32(buf[j * 2 + 1]);
    }
    fdct64_new_avx2(bufA, bufA, cos_bit_row);
    fdct64_new_avx2(bufB, bufB, cos_bit_row);
    round_shift_array_32_avx2(bufA, bufA, 32, -shift[2]);
    round_shift_array_32_avx2(bufB, bufB, 32, -shift[2]);
    store_output_32bit_w16(output + i * 16, bufA, bufB, 32, 32);
  }
}